

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

QSize __thiscall DetailButton::sizeHint(DetailButton *this)

{
  Data *pDVar1;
  char16_t *pcVar2;
  undefined1 *puVar3;
  QStyle *pQVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  undefined8 local_d0;
  QArrayDataPointer<char16_t> local_c8;
  QFontMetrics fm;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  QWidgetData *pQStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  Data *pDStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  QSize QStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::ensurePolished((QWidget *)this);
  local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QStack_40 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pDStack_60 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_90 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)&local_a8);
  (**(code **)(*(long *)&(this->super_QPushButton).super_QAbstractButton.super_QWidget + 0x1b8))
            (this,(QStyleOptionButton *)&local_a8);
  _fm = &DAT_aaaaaaaaaaaaaaaa;
  QWidget::fontMetrics((QWidget *)&fm);
  label((QString *)&local_c8,this,ShowLabel);
  puVar3 = puStack_50;
  pcVar2 = local_58;
  pDVar1 = pDStack_60;
  pDStack_60 = local_c8.d;
  local_58 = local_c8.ptr;
  local_c8.d = pDVar1;
  local_c8.ptr = pcVar2;
  puStack_50 = (undefined1 *)local_c8.size;
  local_c8.size = (qsizetype)puVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  local_d0 = QFontMetrics::size((int)(QWidget *)&fm,(QString *)0x800,(int)&pDStack_60,(int *)0x0);
  pQVar4 = QWidget::style((QWidget *)this);
  uVar5 = (**(code **)(*(long *)pQVar4 + 0xe8))
                    (pQVar4,0,(QStyleOptionButton *)&local_a8,&local_d0,this);
  label((QString *)&local_c8,this,HideLabel);
  puVar3 = puStack_50;
  pcVar2 = local_58;
  pDVar1 = pDStack_60;
  pDStack_60 = local_c8.d;
  local_58 = local_c8.ptr;
  local_c8.d = pDVar1;
  local_c8.ptr = pcVar2;
  puStack_50 = (undefined1 *)local_c8.size;
  local_c8.size = (qsizetype)puVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  local_d0 = QFontMetrics::size((int)&fm,(QString *)0x800,(int)&pDStack_60,(int *)0x0);
  pQVar4 = QWidget::style((QWidget *)this);
  uVar6 = (**(code **)(*(long *)pQVar4 + 0xe8))
                    (pQVar4,0,(QStyleOptionButton *)&local_a8,&local_d0,this);
  uVar7 = uVar6;
  if ((int)uVar6 < (int)uVar5) {
    uVar7 = uVar5;
  }
  if ((int)(uVar6 >> 0x20) < (int)(uVar5 >> 0x20)) {
    uVar6 = uVar5;
  }
  QFontMetrics::~QFontMetrics(&fm);
  QStyleOptionButton::~QStyleOptionButton((QStyleOptionButton *)&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSize)(uVar7 & 0xffffffff | uVar6 & 0xffffffff00000000);
  }
  __stack_chk_fail();
}

Assistant:

QSize sizeHint() const override
    {
        ensurePolished();
        QStyleOptionButton opt;
        initStyleOption(&opt);
        const QFontMetrics fm = fontMetrics();
        opt.text = label(ShowLabel);
        QSize sz = fm.size(Qt::TextShowMnemonic, opt.text);
        QSize ret = style()->sizeFromContents(QStyle::CT_PushButton, &opt, sz, this);
        opt.text = label(HideLabel);
        sz = fm.size(Qt::TextShowMnemonic, opt.text);
        ret = ret.expandedTo(style()->sizeFromContents(QStyle::CT_PushButton, &opt, sz, this));
        return ret;
    }